

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

size_t cmsys::SystemTools::CountChar(char *str,char c)

{
  size_t sVar1;
  char cVar2;
  char *pcVar3;
  
  if ((str != (char *)0x0) && (cVar2 = *str, cVar2 != '\0')) {
    pcVar3 = str + 1;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + (cVar2 == c);
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
    return sVar1;
  }
  return 0;
}

Assistant:

size_t SystemTools::CountChar(const char* str, char c)
{
  size_t count = 0;

  if (str)
    {
    while (*str)
      {
      if (*str == c)
        {
        ++count;
        }
      ++str;
      }
    }
  return count;
}